

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O3

bool __thiscall tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,optional<int> *value)

{
  bool bVar1;
  undefined7 in_register_00000001;
  int v;
  storage_t<int> local_14;
  
  local_14 = SUB74((uint7)in_register_00000001 >> 0x18,0);
  bVar1 = MaybeNone(this);
  if (bVar1) {
    value->has_value_ = false;
    bVar1 = true;
  }
  else {
    bVar1 = ReadBasicType(this,(int *)&local_14);
    if ((bVar1) && (value->contained = local_14, value->has_value_ == false)) {
      value->has_value_ = true;
    }
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<int> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  int v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}